

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::EnumValueDescriptor::DebugString
          (EnumValueDescriptor *this,int depth,string *contents,
          DebugStringOptions *debug_string_options)

{
  FeatureSet *from;
  bool bVar1;
  FeatureSet *this_00;
  Arg *a0;
  string_view format;
  string_view format_00;
  string prefix;
  string formatted_options;
  EnumValueOptions full_options;
  Arg local_f8;
  SourceLocationCommentPrinter comment_printer;
  
  prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
  std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
  comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.leading_comments.field_2;
  comment_printer.source_loc_.leading_comments._M_string_length = 0;
  comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
       (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
  comment_printer.source_loc_.trailing_comments._M_string_length = 0;
  comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  comment_printer.source_loc_.leading_detached_comments.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  comment_printer.options_.include_comments = debug_string_options->include_comments;
  comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
  comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
  std::__cxx11::string::string((string *)&comment_printer.prefix_,(string *)&prefix);
  if (debug_string_options->include_comments == true) {
    comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
  }
  else {
    comment_printer.have_source_loc_ = false;
  }
  anon_unknown_24::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
  full_options.super_Message.super_MessageLite._vptr_MessageLite =
       (_func_int **)prefix._M_string_length;
  full_options.super_Message.super_MessageLite._internal_metadata_.ptr_ =
       (intptr_t)prefix._M_dataplus._M_p;
  local_f8.piece_._M_str = (this->all_names_->_M_dataplus)._M_p;
  local_f8.piece_._M_len = this->all_names_->_M_string_length;
  absl::lts_20250127::substitute_internal::Arg::Arg((Arg *)&formatted_options,this->number_);
  a0 = &local_f8;
  format._M_str = (char *)&full_options;
  format._M_len = (size_t)"$0$1 = $2";
  absl::lts_20250127::SubstituteAndAppend
            ((lts_20250127 *)contents,(Nonnull<std::string_*>)0x9,format,a0,
             (Arg *)&formatted_options,(Arg *)prefix._M_dataplus._M_p);
  EnumValueOptions::EnumValueOptions(&full_options,this->options_);
  from = this->proto_features_;
  if (from != (FeatureSet *)_FeatureSet_default_instance_) {
    this_00 = EnumValueOptions::mutable_features(&full_options);
    FeatureSet::CopyFrom(this_00,from);
  }
  formatted_options._M_dataplus._M_p = (pointer)&formatted_options.field_2;
  formatted_options._M_string_length = 0;
  formatted_options.field_2._M_local_buf[0] = '\0';
  bVar1 = anon_unknown_24::FormatBracketedOptions
                    ((anon_unknown_24 *)(ulong)(uint)depth,(int)&full_options,
                     (Message *)this->type_->file_->pool_,(DescriptorPool *)&formatted_options,
                     (string *)a0);
  if (bVar1) {
    local_f8.piece_._M_len = formatted_options._M_string_length;
    local_f8.piece_._M_str = formatted_options._M_dataplus._M_p;
    format_00._M_str = " [$0]";
    format_00._M_len = 5;
    absl::lts_20250127::SubstituteAndAppend(contents,format_00,&local_f8);
  }
  std::__cxx11::string::append((char *)contents);
  anon_unknown_24::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
  std::__cxx11::string::~string((string *)&formatted_options);
  EnumValueOptions::~EnumValueOptions(&full_options);
  anon_unknown_24::SourceLocationCommentPrinter::~SourceLocationCommentPrinter(&comment_printer);
  std::__cxx11::string::~string((string *)&prefix);
  return;
}

Assistant:

void EnumValueDescriptor::DebugString(
    int depth, std::string* contents,
    const DebugStringOptions& debug_string_options) const {
  std::string prefix(depth * 2, ' ');

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  absl::SubstituteAndAppend(contents, "$0$1 = $2", prefix, name(), number());

  EnumValueOptions full_options = options();
  CopyFeaturesToOptions(proto_features_, &full_options);
  std::string formatted_options;
  if (FormatBracketedOptions(depth, full_options, type()->file()->pool(),
                             &formatted_options)) {
    absl::SubstituteAndAppend(contents, " [$0]", formatted_options);
  }
  contents->append(";\n");

  comment_printer.AddPostComment(contents);
}